

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

void test_reader(reader *r)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  int iVar4;
  
  iVar1 = (*r->_vptr_reader[2])();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"FIRST CHAR : ",0xd);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&jlog,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  iVar2 = (*r->_vptr_reader[2])(r);
  iVar4 = 1;
  if (iVar2 != -1) {
    do {
      iVar4 = iVar4 + 1;
      iVar2 = (*r->_vptr_reader[2])(r);
    } while (iVar2 != -1);
    iVar1 = iVar1 + iVar4 + -1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"LENGTH : ",9);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&jlog,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&jlog,"SUM    : ",9);
  plVar3 = (long *)std::ostream::operator<<((ostream *)&jlog,iVar1);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void test_reader(reader &r)
{
    int sum = 0;
    int c = r.next();
    sum += c;
    jlog << "FIRST CHAR : " << c << endl;
    int n = 1;
    while ((c = r.next() != EOF))
    {
        sum += c;
        n++;
    }
    jlog << "LENGTH : " << n << endl;
    jlog << "SUM    : " << sum << endl;
}